

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare::operator()
          (ExtensionCompare *this,ExtensionEntry *a,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> *b)

{
  bool bVar1;
  string_view local_48;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_38;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> *local_20;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> *b_local;
  ExtensionEntry *a_local;
  ExtensionCompare *this_local;
  
  local_20 = b;
  b_local = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)a;
  a_local = (ExtensionEntry *)this;
  local_48 = ExtensionEntry::extendee(a,this->index);
  std::make_tuple<std::basic_string_view<char,std::char_traits<char>>,int_const&>
            (&local_38,&local_48,
             (int *)&b_local[1].
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>
                     .
                     super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_str);
  bVar1 = std::operator<(&local_38,b);
  return bVar1;
}

Assistant:

bool operator()(const ExtensionEntry& a,
                    std::tuple<absl::string_view, int> b) const {
      return std::make_tuple(a.extendee(index), a.extension_number) < b;
    }